

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  size_t sVar5;
  bool help;
  bool verbose;
  Options ops;
  environment env;
  communicator world;
  Session session;
  bool local_462;
  bool local_461;
  _List_node_base *local_460;
  _List_node_base *local_458;
  _List_node_base *local_450;
  _List_node_base *local_448;
  _List_node_base *local_440;
  _List_node_base *local_438;
  _List_node_base *local_430;
  _List_node_base *local_428;
  Options local_420;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  char **local_288;
  undefined1 local_27c [4];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  communicator local_1d8;
  Session local_1c0;
  
  local_420.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       CONCAT44(local_420.args.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next._4_4_,argc);
  local_1c0.super_NonCopyable._vptr_NonCopyable = (_func_int **)argv;
  MPI_Init_thread(&local_420,&local_1c0,1,local_27c);
  local_1d8.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  local_1d8.rank_ = 0;
  local_1d8.size_ = 1;
  local_1d8.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(local_1d8.comm_.data);
  Catch::Session::Session(&local_1c0);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_420.options;
  local_420.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_420.failed = false;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_420.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_420;
  local_420.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_420;
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"number","");
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"number of points per block","");
  opts::Option<unsigned_long>
            ((opts *)&local_428,'n',&local_2a8,&SwapReduceFixture::num_points,&local_2c8);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_428;
  local_428 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"k","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"use k-ary swap","");
  opts::Option<int>((opts *)&local_430,'k',&local_2e8,&SwapReduceFixture::k,&local_308);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_430;
  local_430 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"blocks","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"number of blocks","");
  opts::Option<int>((opts *)&local_438,'b',&local_328,&SwapReduceFixture::nblocks,&local_348);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_438;
  local_438 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"thread","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"number of threads","");
  opts::Option<int>((opts *)&local_440,'t',&local_368,&SwapReduceFixture::threads,&local_388);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_440;
  local_440 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"memory","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"number of blocks to keep in memory","");
  opts::Option<int>((opts *)&local_448,'m',&local_3a8,&SwapReduceFixture::mem_blocks,&local_3c8);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_448;
  local_448 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"prefix","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"prefix for external storage","");
  opts::Option<std::__cxx11::string>
            ((opts *)&local_450,&local_1f8,&SwapReduceFixture::prefix_abi_cxx11_,&local_218);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_450;
  local_450 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"verbose","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"print the block contents","");
  opts::Option<bool>((opts *)&local_458,'v',&local_238,&local_461,&local_3e8);
  local_288 = argv;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_458;
  local_458 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"help","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"show help","");
  opts::Option<bool>((opts *)&local_460,'h',&local_258,&local_462,&local_278);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = local_460;
  local_460 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_420.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_420.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_460 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_460 + 8))();
  }
  local_460 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_458 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_458 + 8))();
  }
  local_458 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_450 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_450 + 8))();
  }
  local_450 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_448 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_448 + 8))();
  }
  local_448 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (local_440 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_440 + 8))();
  }
  local_440 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_438 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_438 + 8))();
  }
  local_438 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_430 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_430 + 8))();
  }
  local_430 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_428 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_428 + 8))();
  }
  local_428 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  ppcVar1 = local_288;
  bVar2 = opts::Options::parse(&local_420,argc,local_288);
  if ((bVar2) && (local_462 != true)) {
    iVar3 = Catch::Session::run(&local_1c0);
  }
  else {
    iVar3 = 1;
    if (local_1d8.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *ppcVar1;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1cf588);
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Generates random particles in the domain and redistributes them into correct blocks.\n"
                 ,0x55);
      opts::operator<<((ostream *)&std::cout,&local_420);
    }
  }
  Catch::clara::std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&local_420.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  Catch::clara::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_420);
  Catch::Session::~Session(&local_1c0);
  diy::mpi::communicator::~communicator(&local_1d8);
  MPI_Finalize();
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    Catch::Session session;

    bool help, verbose;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('n', "number",  SwapReduceFixture::num_points,     "number of points per block")
        >> Option('k', "k",       SwapReduceFixture::k,              "use k-ary swap")
        >> Option('b', "blocks",  SwapReduceFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  SwapReduceFixture::threads,        "number of threads")
        >> Option('m', "memory",  SwapReduceFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option(     "prefix",  SwapReduceFixture::prefix,         "prefix for external storage")
        >> Option('v', "verbose", verbose,                           "print the block contents")
        >> Option('h', "help",    help,                              "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Generates random particles in the domain and redistributes them into correct blocks.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}